

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O0

byte * __thiscall nuraft::buffer::get_bytes(buffer *this,size_t *len)

{
  size_t sVar1;
  size_t sVar2;
  overflow_error *poVar3;
  byte *pbVar4;
  ulong *in_RSI;
  buffer *in_RDI;
  int32 byte_val;
  size_t i;
  int32 val;
  byte *d;
  size_t avail;
  ulong local_40;
  int local_34;
  
  sVar1 = size(in_RDI);
  sVar2 = pos(in_RDI);
  if (sVar1 - sVar2 < 4) {
    poVar3 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error
              (poVar3,"insufficient buffer available for a bytes length (int32)");
    __cxa_throw(poVar3,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  pbVar4 = data(in_RDI);
  local_34 = 0;
  for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
    local_34 = ((uint)pbVar4[local_40] << ((byte)(local_40 << 3) & 0x1f)) + local_34;
  }
  if ((*(uint *)in_RDI & 0x80000000) == 0) {
    *(short *)(in_RDI + 2) = *(short *)(in_RDI + 2) + 4;
  }
  else {
    *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + 4;
  }
  *in_RSI = (long)local_34;
  pbVar4 = data(in_RDI);
  sVar1 = size(in_RDI);
  sVar2 = pos(in_RDI);
  if (sVar1 - sVar2 < *in_RSI) {
    poVar3 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(poVar3,"insufficient buffer available for a byte array");
    __cxa_throw(poVar3,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  if ((*(uint *)in_RDI & 0x80000000) == 0) {
    *(short *)(in_RDI + 2) = *(short *)(in_RDI + 2) + (short)*in_RSI;
  }
  else {
    *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + (int)*in_RSI;
  }
  return pbVar4;
}

Assistant:

const byte* buffer::get_bytes(size_t& len)
{
    size_t avail = size() - pos();
    if (avail < sz_int) {
        throw std::overflow_error
              ( "insufficient buffer available for a bytes length (int32)" );
    }

    byte* d = data();
    int32 val = 0;
    for (size_t i = 0; i < sz_int; ++i) {
        int32 byte_val = (int32)*(d + i);
        val += (byte_val << (i * 8));
    }

    __mv_fw_block(this, sz_int);
    len = val;

    d = data();
    if ( size() - pos() < len) {
        throw std::overflow_error
              ( "insufficient buffer available for a byte array" );
    }

    __mv_fw_block(this, len);
    return reinterpret_cast<const byte*>(d);
}